

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O0

int Nwk_ObjFindFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  bool bVar1;
  int local_2c;
  Nwk_Obj_t *pNStack_28;
  int i;
  Nwk_Obj_t *pTemp;
  Nwk_Obj_t *pFanin_local;
  Nwk_Obj_t *pObj_local;
  
  local_2c = 0;
  while( true ) {
    bVar1 = false;
    if (local_2c < pObj->nFanins) {
      pNStack_28 = pObj->pFanio[local_2c];
      bVar1 = pNStack_28 != (Nwk_Obj_t *)0x0;
    }
    if (!bVar1) break;
    if (pNStack_28 == pFanin) {
      return local_2c;
    }
    local_2c = local_2c + 1;
  }
  return -1;
}

Assistant:

int Nwk_ObjFindFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{  
    Nwk_Obj_t * pTemp;
    int i;
    Nwk_ObjForEachFanin( pObj, pTemp, i )
        if ( pTemp == pFanin )
            return i;
    return -1;
}